

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this)

{
  UnknownFieldSet *this_00;
  
  if ((this->ptr_ & 1U) == 0) {
    this_00 = mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this);
  }
  else {
    this_00 = (UnknownFieldSet *)((this->ptr_ & 0xfffffffffffffffcU) + 8);
  }
  if ((this_00->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_00->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    UnknownFieldSet::ClearFallback(this_00);
    return;
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void DoClear() {
    mutable_unknown_fields<T>()->Clear();
  }